

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_world.cc
# Opt level: O1

void sptk::world::dctsub(int n,double *a,int nc,double *c)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  double *pdVar7;
  double *pdVar8;
  double dVar9;
  double dVar10;
  
  uVar5 = n >> 1;
  if (1 < (int)uVar5) {
    lVar6 = (long)(nc / n);
    pdVar3 = c + (nc - lVar6);
    pdVar7 = c + lVar6;
    pdVar8 = a + n;
    uVar4 = 1;
    do {
      pdVar8 = pdVar8 + -1;
      dVar10 = *pdVar7 - *pdVar3;
      dVar9 = *pdVar7 + *pdVar3;
      dVar1 = a[uVar4];
      dVar2 = *pdVar8;
      a[uVar4] = dVar10 * dVar1 + dVar9 * dVar2;
      *pdVar8 = dVar9 * dVar1 - dVar2 * dVar10;
      uVar4 = uVar4 + 1;
      pdVar3 = pdVar3 + -lVar6;
      pdVar7 = pdVar7 + lVar6;
    } while (uVar5 != uVar4);
  }
  a[(int)uVar5] = *c * a[(int)uVar5];
  return;
}

Assistant:

void dctsub(int n, double *a, int nc, double *c) {
  int j, k, kk, ks, m;
  double wkr, wki, xr;

  m = n >> 1;
  ks = nc / n;
  kk = 0;
  for (j = 1; j < m; j++) {
    k = n - j;
    kk += ks;
    wkr = c[kk] - c[nc - kk];
    wki = c[kk] + c[nc - kk];
    xr = wki * a[j] - wkr * a[k];
    a[j] = wkr * a[j] + wki * a[k];
    a[k] = xr;
  }
  a[m] *= c[0];
}